

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::anon_unknown_0::LoopUnswitch::IsDynamicallyUniform
          (LoopUnswitch *this,Instruction *var,BasicBlock *entry,DominatorTree *post_dom_tree)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t b;
  DefUseManager *this_00;
  iterator iVar3;
  DecorationManager *this_01;
  _func_void *p_Var4;
  BasicBlock *this_02;
  Instruction *pIVar5;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  if (post_dom_tree->postdominator_ == false) {
    __assert_fail("post_dom_tree.IsPostDominator()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                  ,0x1ed,
                  "bool spvtools::opt::(anonymous namespace)::LoopUnswitch::IsDynamicallyUniform(Instruction *, const BasicBlock *, const DominatorTree &)"
                 );
  }
  this_00 = IRContext::get_def_use_mgr(this->context_);
  local_70._0_4_ = Instruction::result_id(var);
  iVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->dynamically_uniform_)._M_h,(key_type_conflict *)local_70._M_pod_data);
  if (iVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>._M_cur !=
      (__node_type *)0x0) {
    return (bool)*(undefined1 *)
                  ((long)iVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>
                         ._M_cur + 0xc);
  }
  this_01 = IRContext::get_decoration_mgr(this->context_);
  local_70._0_4_ = Instruction::result_id(var);
  p_Var4 = (_func_void *)
           std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->dynamically_uniform_,(key_type *)local_70._M_pod_data);
  *p_Var4 = (_func_void)0x0;
  uVar2 = Instruction::result_id(var);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:507:34)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:507:34)>
             ::_M_manager;
  local_50._M_unused._M_function_pointer = p_Var4;
  analysis::DecorationManager::WhileEachDecoration
            (this_01,uVar2,0x1a,(function<bool_(const_spvtools::opt::Instruction_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (*p_Var4 != (_func_void)0x0) {
    return true;
  }
  this_02 = IRContext::get_instr_block(this->context_,var);
  if (this_02 == (BasicBlock *)0x0) {
    *p_Var4 = (_func_void)0x1;
    return true;
  }
  uVar2 = BasicBlock::id(this_02);
  b = BasicBlock::id(entry);
  bVar1 = DominatorTree::Dominates(post_dom_tree,uVar2,b);
  if (bVar1) {
    if (var->opcode_ == OpLoad) {
      uVar2 = Instruction::GetSingleWordInOperand(var,0);
      pIVar5 = analysis::DefUseManager::GetDef(this_00,uVar2);
      uVar2 = Instruction::type_id(pIVar5);
      pIVar5 = analysis::DefUseManager::GetDef(this_00,uVar2);
      uVar2 = Instruction::GetSingleWordInOperand(pIVar5,0);
      if ((uVar2 & 0xfffffffd) == 0) {
LAB_0021d112:
        local_70._8_8_ = 0;
        local_70._M_unused._M_object = operator_new(0x18);
        *(BasicBlock **)local_70._M_unused._0_8_ = entry;
        *(DominatorTree **)((long)local_70._M_unused._0_8_ + 8) = post_dom_tree;
        *(LoopUnswitch **)((long)local_70._M_unused._0_8_ + 0x10) = this;
        local_58 = std::
                   _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:539:44)>
                   ::_M_invoke;
        local_60 = std::
                   _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:539:44)>
                   ::_M_manager;
        bVar1 = Instruction::WhileEachInId(var,(function<bool_(unsigned_int_*)> *)&local_70);
        *p_Var4 = (_func_void)bVar1;
        if (local_60 == (code *)0x0) {
          return bVar1;
        }
        (*local_60)(&local_70,&local_70,__destroy_functor);
        return bVar1;
      }
    }
    else {
      bVar1 = IRContext::IsCombinatorInstruction(this->context_,var);
      if (bVar1) goto LAB_0021d112;
    }
  }
  *p_Var4 = (_func_void)0x0;
  return false;
}

Assistant:

bool IsDynamicallyUniform(Instruction* var, const BasicBlock* entry,
                            const DominatorTree& post_dom_tree) {
    assert(post_dom_tree.IsPostDominator());
    analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

    auto it = dynamically_uniform_.find(var->result_id());

    if (it != dynamically_uniform_.end()) return it->second;

    analysis::DecorationManager* dec_mgr = context_->get_decoration_mgr();

    bool& is_uniform = dynamically_uniform_[var->result_id()];
    is_uniform = false;

    dec_mgr->WhileEachDecoration(var->result_id(),
                                 uint32_t(spv::Decoration::Uniform),
                                 [&is_uniform](const Instruction&) {
                                   is_uniform = true;
                                   return false;
                                 });
    if (is_uniform) {
      return is_uniform;
    }

    BasicBlock* parent = context_->get_instr_block(var);
    if (!parent) {
      return is_uniform = true;
    }

    if (!post_dom_tree.Dominates(parent->id(), entry->id())) {
      return is_uniform = false;
    }
    if (var->opcode() == spv::Op::OpLoad) {
      const uint32_t PtrTypeId =
          def_use_mgr->GetDef(var->GetSingleWordInOperand(0))->type_id();
      const Instruction* PtrTypeInst = def_use_mgr->GetDef(PtrTypeId);
      auto storage_class = spv::StorageClass(
          PtrTypeInst->GetSingleWordInOperand(kTypePointerStorageClassInIdx));
      if (storage_class != spv::StorageClass::Uniform &&
          storage_class != spv::StorageClass::UniformConstant) {
        return is_uniform = false;
      }
    } else {
      if (!context_->IsCombinatorInstruction(var)) {
        return is_uniform = false;
      }
    }

    return is_uniform = var->WhileEachInId([entry, &post_dom_tree,
                                            this](const uint32_t* id) {
      return IsDynamicallyUniform(context_->get_def_use_mgr()->GetDef(*id),
                                  entry, post_dom_tree);
    });
  }